

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

FxExpression * __thiscall FxAddSub::Resolve(FxAddSub *this,FCompileContext *ctx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FxConstant *pFVar4;
  PType *pPVar5;
  double dVar6;
  uint local_110;
  uint local_10c;
  double local_e0;
  double local_d8;
  FxExpression *e_1;
  uint local_8c;
  undefined1 local_88 [4];
  int v2_1;
  uint local_78;
  uint local_74;
  int v1_1;
  int v_1;
  FxExpression *e;
  double local_58;
  double v2;
  undefined1 local_40 [24];
  double v1;
  double v;
  FCompileContext *ctx_local;
  FxAddSub *this_local;
  
  this_local = this;
  if (((this->super_FxBinary).super_FxExpression.isresolved & 1U) == 0) {
    (this->super_FxBinary).super_FxExpression.isresolved = true;
    v = (double)ctx;
    ctx_local = (FCompileContext *)this;
    bVar1 = FxBinary::ResolveLR(&this->super_FxBinary,ctx,true);
    if (bVar1) {
      bVar1 = FxExpression::IsNumeric((FxExpression *)this);
      if (bVar1) {
        uVar2 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
        if (((uVar2 & 1) == 0) ||
           (uVar2 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])(), (uVar2 & 1) == 0)) {
          FxBinary::Promote(&this->super_FxBinary,(FCompileContext *)v);
          this_local = this;
        }
        else {
          iVar3 = (*(((this->super_FxBinary).super_FxExpression.ValueType)->super_DObject).
                    _vptr_DObject[0x12])();
          if (iVar3 == 1) {
            FxConstant::GetValue((FxConstant *)local_40);
            pPVar5 = (PType *)ExpVal::GetFloat((ExpVal *)local_40);
            ExpVal::~ExpVal((ExpVal *)local_40);
            local_40._16_8_ = pPVar5;
            FxConstant::GetValue((FxConstant *)&e);
            dVar6 = ExpVal::GetFloat((ExpVal *)&e);
            ExpVal::~ExpVal((ExpVal *)&e);
            if (*(int *)&(this->super_FxBinary).super_FxExpression.field_0x34 == 0x2b) {
              local_d8 = (double)local_40._16_8_ + dVar6;
            }
            else {
              if (*(int *)&(this->super_FxBinary).super_FxExpression.field_0x34 == 0x2d) {
                local_e0 = (double)local_40._16_8_ - dVar6;
              }
              else {
                local_e0 = 0.0;
              }
              local_d8 = local_e0;
            }
            v1 = local_d8;
            local_58 = dVar6;
            pFVar4 = (FxConstant *)operator_new(0x48);
            FxConstant::FxConstant
                      (pFVar4,v1,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
            _v1_1 = (char *)pFVar4;
            if (this != (FxAddSub *)0x0) {
              (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
            }
            this_local = (FxAddSub *)_v1_1;
          }
          else {
            FxConstant::GetValue((FxConstant *)local_88);
            uVar2 = ExpVal::GetInt((ExpVal *)local_88);
            ExpVal::~ExpVal((ExpVal *)local_88);
            local_78 = uVar2;
            FxConstant::GetValue((FxConstant *)&e_1);
            uVar2 = ExpVal::GetInt((ExpVal *)&e_1);
            ExpVal::~ExpVal((ExpVal *)&e_1);
            if (*(int *)&(this->super_FxBinary).super_FxExpression.field_0x34 == 0x2b) {
              local_10c = local_78 + uVar2;
            }
            else {
              if (*(int *)&(this->super_FxBinary).super_FxExpression.field_0x34 == 0x2d) {
                local_110 = local_78 - uVar2;
              }
              else {
                local_110 = 0;
              }
              local_10c = local_110;
            }
            local_74 = local_10c;
            local_8c = uVar2;
            pFVar4 = (FxConstant *)operator_new(0x48);
            FxConstant::FxConstant
                      (pFVar4,local_74,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
            this_local = (FxAddSub *)pFVar4;
            if (this != (FxAddSub *)0x0) {
              (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
            }
          }
        }
      }
      else {
        FScriptPosition::Message
                  (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
                   "Numeric type expected");
        if (this != (FxAddSub *)0x0) {
          (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
        }
        this_local = (FxAddSub *)0x0;
      }
    }
    else {
      this_local = (FxAddSub *)0x0;
    }
  }
  return (FxExpression *)this_local;
}

Assistant:

FxExpression *FxAddSub::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	if (!ResolveLR(ctx, true)) return NULL;

	if (!IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
	else if (left->isConstant() && right->isConstant())
	{
		if (ValueType->GetRegType() == REGT_FLOAT)
		{
			double v;
			double v1 = static_cast<FxConstant *>(left)->GetValue().GetFloat();
			double v2 = static_cast<FxConstant *>(right)->GetValue().GetFloat();

			v =	Operator == '+'? v1 + v2 : 
				Operator == '-'? v1 - v2 : 0;

			FxExpression *e = new FxConstant(v, ScriptPosition);
			delete this;
			return e;
		}
		else
		{
			int v;
			int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
			int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();

			v =	Operator == '+'? v1 + v2 : 
				Operator == '-'? v1 - v2 : 0;

			FxExpression *e = new FxConstant(v, ScriptPosition);
			delete this;
			return e;

		}
	}
	Promote(ctx);
	return this;
}